

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HuffmanTree.h
# Opt level: O3

void __thiscall
bwtil::HuffmanTree<unsigned_char>::storeTree
          (HuffmanTree<unsigned_char> *this,Node n,
          vector<bwtil::HuffmanTree<unsigned_char>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_char>::Node>_>
          *nodes_vec)

{
  vector<bwtil::HuffmanTree<unsigned_char>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_char>::Node>_>
  local_50;
  vector<bool,_std::allocator<bool>_> local_38;
  
  local_38.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_38.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_38.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_38.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._12_4_ = 0;
  local_38.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_38.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_38.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._12_4_ = 0;
  std::
  vector<bwtil::HuffmanTree<unsigned_char>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_char>::Node>_>
  ::vector(&local_50,nodes_vec);
  storeTree(this,&local_38,n,&local_50);
  if (local_50.
      super__Vector_base<bwtil::HuffmanTree<unsigned_char>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_char>::Node>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.
                    super__Vector_base<bwtil::HuffmanTree<unsigned_char>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_char>::Node>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_38.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_38.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void storeTree(Node n,vector<Node> nodes_vec){

			//root_node = n.node_number;
			storeTree(vector<bool>(),n,nodes_vec);

		}